

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Vector<int,_2>_>::genFixeds
          (DefaultSampling<tcu::Vector<int,_2>_> *this,FloatFormat *fmt,
          vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *dst)

{
  size_t scalarNdx;
  ulong uVar1;
  vector<int,_std::allocator<int>_> scalars;
  Vector<int,_2> local_40;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DefaultSampling<int>::genFixeds
            ((DefaultSampling<int> *)
             &instance<vkt::shaderexecutor::DefaultSampling<int>>()::s_instance,fmt,
             (vector<int,_std::allocator<int>_> *)&local_38);
  for (uVar1 = 0;
      uVar1 < (ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_38._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar1 = uVar1 + 1) {
    local_40.m_data[0] = local_38._M_impl.super__Vector_impl_data._M_start[uVar1];
    local_40.m_data[1] = local_40.m_data[0];
    std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>::
    emplace_back<tcu::Vector<int,2>>
              ((vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *)dst,&local_40);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));
	}